

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::TestSpec::NamePattern::matches(NamePattern *this,TestCaseInfo *testCase)

{
  bool bVar1;
  string local_30;
  
  toLower(&local_30,&testCase->name);
  bVar1 = WildcardPattern::matches(&this->m_wildcardPattern,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

virtual bool matches( TestCaseInfo const& testCase ) const {
                return m_wildcardPattern.matches( toLower( testCase.name ) );
            }